

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl_rtc.cc
# Opt level: O2

bool __thiscall
aom::AV1RateControlRTC::InitRateControl(AV1RateControlRTC *this,AV1RateControlRtcConfig *rc_cfg)

{
  AV1EncoderConfig *oxcf;
  AV1_COMP *pAVar1;
  SequenceHeader *pSVar2;
  AV1_PRIMARY *pAVar3;
  AV1_COMP *pAVar4;
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  BLOCK_SIZE BVar10;
  long lVar11;
  uint uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  
  pAVar1 = this->cpi_;
  pSVar2 = (pAVar1->common).seq_params;
  pSVar2->profile = '\0';
  pSVar2->bit_depth = AOM_BITS_8;
  uVar12 = 1;
  (pAVar1->common).show_frame = 1;
  (pAVar1->oxcf).profile = '\0';
  (pAVar1->oxcf).mode = '\x01';
  (pAVar1->oxcf).rc_cfg.mode = AOM_CBR;
  (pAVar1->oxcf).pass = AOM_RC_ONE_PASS;
  (pAVar1->oxcf).q_cfg.aq_mode = (rc_cfg->aq_mode != 0) * '\x03';
  (pAVar1->oxcf).tune_cfg.content = AOM_CONTENT_DEFAULT;
  (pAVar1->oxcf).rc_cfg.drop_frames_water_mark = rc_cfg->frame_drop_thresh;
  if (0 < rc_cfg->max_consec_drop_ms) {
    dVar5 = ceil(((double)rc_cfg->max_consec_drop_ms * pAVar1->framerate) / 1000.0);
    uVar13 = 0xffc00000;
    uVar14 = 0x41dfffff;
    if (dVar5 <= 2147483647.0) {
      uVar13 = SUB84(dVar5,0);
      uVar14 = (undefined4)((ulong)dVar5 >> 0x20);
    }
    (pAVar1->rc).max_consec_drop = (int)(double)CONCAT44(uVar14,uVar13);
  }
  oxcf = &pAVar1->oxcf;
  (pAVar1->svc).framedrop_mode = AOM_FULL_SUPERFRAME_DROP;
  (pAVar1->oxcf).tool_cfg.bit_depth = AOM_BITS_8;
  (pAVar1->oxcf).tool_cfg.superblock_size = AOM_SUPERBLOCK_SIZE_DYNAMIC;
  (pAVar1->oxcf).algo_cfg.loopfilter_control = LOOPFILTER_ALL;
  (pAVar1->common).current_frame.frame_number = 0;
  (pAVar1->ppi->p_rc).kf_boost = 0x8fc;
  for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 1) {
    (pAVar1->oxcf).target_seq_level_idx[lVar11] = '\x1f';
  }
  pAVar3 = this->cpi_->ppi;
  uVar6 = *(undefined8 *)(pAVar1->oxcf).target_seq_level_idx;
  uVar7 = *(undefined8 *)((pAVar1->oxcf).target_seq_level_idx + 8);
  uVar8 = *(undefined8 *)((pAVar1->oxcf).target_seq_level_idx + 0x18);
  *(undefined8 *)((pAVar3->level_params).target_seq_level_idx + 0x10) =
       *(undefined8 *)((pAVar1->oxcf).target_seq_level_idx + 0x10);
  *(undefined8 *)((pAVar3->level_params).target_seq_level_idx + 0x18) = uVar8;
  *(undefined8 *)(pAVar3->level_params).target_seq_level_idx = uVar6;
  *(undefined8 *)((pAVar3->level_params).target_seq_level_idx + 8) = uVar7;
  bVar9 = UpdateRateControl(this,rc_cfg);
  if (bVar9) {
    pSVar2 = (pAVar1->common).seq_params;
    BVar10 = av1_select_sb_size(oxcf,(pAVar1->common).width,(pAVar1->common).height,
                                (this->cpi_->svc).number_spatial_layers);
    pSVar2->sb_size = BVar10;
    pSVar2->mib_size =
         (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar10];
    pSVar2->mib_size_log2 = (uint)""[BVar10];
    pAVar4 = this->cpi_;
    if ((pAVar4->svc).number_spatial_layers < 2) {
      uVar12 = (uint)(1 < (pAVar4->svc).number_temporal_layers);
    }
    pAVar3 = pAVar4->ppi;
    pAVar3->use_svc = uVar12;
    av1_primary_rc_init(oxcf,&pAVar3->p_rc);
    (pAVar1->rc).rc_1_frame = 0;
    (pAVar1->rc).rc_2_frame = 0;
    av1_rc_init_minq_luts();
    av1_rc_init(oxcf,&pAVar1->rc);
    pAVar1 = this->cpi_;
    (pAVar1->rc).rtc_external_ratectrl = 1;
    (pAVar1->sf).rt_sf.use_nonrd_pick_mode = 1;
  }
  return bVar9;
}

Assistant:

bool AV1RateControlRTC::InitRateControl(const AV1RateControlRtcConfig &rc_cfg) {
  AV1_COMMON *cm = &cpi_->common;
  AV1EncoderConfig *oxcf = &cpi_->oxcf;
  RATE_CONTROL *const rc = &cpi_->rc;
  cm->seq_params->profile = PROFILE_0;
  cm->seq_params->bit_depth = AOM_BITS_8;
  cm->show_frame = 1;
  oxcf->profile = cm->seq_params->profile;
  oxcf->mode = REALTIME;
  oxcf->rc_cfg.mode = AOM_CBR;
  oxcf->pass = AOM_RC_ONE_PASS;
  oxcf->q_cfg.aq_mode = rc_cfg.aq_mode ? CYCLIC_REFRESH_AQ : NO_AQ;
  oxcf->tune_cfg.content = AOM_CONTENT_DEFAULT;
  oxcf->rc_cfg.drop_frames_water_mark = rc_cfg.frame_drop_thresh;
  if (rc_cfg.max_consec_drop_ms > 0) {
    rc->max_consec_drop = saturate_cast_double_to_int(
        ceil(cpi_->framerate * rc_cfg.max_consec_drop_ms / 1000));
  }
  cpi_->svc.framedrop_mode = AOM_FULL_SUPERFRAME_DROP;
  oxcf->tool_cfg.bit_depth = AOM_BITS_8;
  oxcf->tool_cfg.superblock_size = AOM_SUPERBLOCK_SIZE_DYNAMIC;
  oxcf->algo_cfg.loopfilter_control = LOOPFILTER_ALL;
  cm->current_frame.frame_number = 0;
  cpi_->ppi->p_rc.kf_boost = DEFAULT_KF_BOOST_RT;
  for (auto &lvl_idx : oxcf->target_seq_level_idx) lvl_idx = SEQ_LEVEL_MAX;

  memcpy(cpi_->ppi->level_params.target_seq_level_idx,
         oxcf->target_seq_level_idx, sizeof(oxcf->target_seq_level_idx));
  if (!UpdateRateControl(rc_cfg)) return false;
  set_sb_size(cm->seq_params,
              av1_select_sb_size(oxcf, cm->width, cm->height,
                                 cpi_->svc.number_spatial_layers));
  cpi_->ppi->use_svc = cpi_->svc.number_spatial_layers > 1 ||
                       cpi_->svc.number_temporal_layers > 1;
  av1_primary_rc_init(oxcf, &cpi_->ppi->p_rc);
  rc->rc_1_frame = 0;
  rc->rc_2_frame = 0;
  av1_rc_init_minq_luts();
  av1_rc_init(oxcf, rc);
  // Enable external rate control.
  cpi_->rc.rtc_external_ratectrl = 1;
  cpi_->sf.rt_sf.use_nonrd_pick_mode = 1;
  return true;
}